

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManBlackBoxIoNum(Tim_Man_t *p,int *pnBbIns,int *pnBbOuts)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  *pnBbOuts = 0;
  *pnBbIns = 0;
  pVVar2 = p->vBoxes;
  if ((pVVar2 != (Vec_Ptr_t *)0x0) && (0 < pVVar2->nSize)) {
    lVar3 = 0;
    do {
      if (*(int *)((long)pVVar2->pArray[lVar3] + 0x18) != 0) {
        iVar1 = Tim_ManBoxInputNum(p,(int)lVar3);
        *pnBbIns = *pnBbIns + iVar1;
        iVar1 = Tim_ManBoxOutputNum(p,(int)lVar3);
        *pnBbOuts = *pnBbOuts + iVar1;
        pVVar2 = p->vBoxes;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Tim_ManBlackBoxIoNum( Tim_Man_t * p, int * pnBbIns, int * pnBbOuts )
{
    Tim_Box_t * pBox;
    int i;
    *pnBbIns = *pnBbOuts = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
        {
            if ( !pBox->fBlack )//&& pBox->nInputs <= 6 )
                continue;
            *pnBbIns  += Tim_ManBoxInputNum( p, i );
            *pnBbOuts += Tim_ManBoxOutputNum( p, i );
        }
}